

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexMatcher::isUWordBoundary(RegexMatcher *this,int64_t pos)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  Locale *key;
  RuleBasedBreakIterator *pRVar4;
  UErrorCode local_28;
  UBool local_21;
  UErrorCode status;
  UBool returnVal;
  int64_t pos_local;
  RegexMatcher *this_local;
  
  local_21 = 0;
  _status = pos;
  pos_local = (int64_t)this;
  if (this->fWordBreakItr == (RuleBasedBreakIterator *)0x0) {
    key = Locale::getEnglish();
    pRVar4 = (RuleBasedBreakIterator *)BreakIterator::createWordInstance(key,&this->fDeferredStatus)
    ;
    this->fWordBreakItr = pRVar4;
    UVar1 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar1 != '\0') {
      return '\0';
    }
    (*(this->fWordBreakItr->super_BreakIterator).super_UObject._vptr_UObject[8])
              (this->fWordBreakItr,this->fInputText,&this->fDeferredStatus);
  }
  if ((long)_status < this->fLookLimit) {
    if (this->fInputText->pFuncs->mapNativeIndexToUTF16 != (UTextMapNativeIndexToUTF16 *)0x0) {
      local_28 = U_ZERO_ERROR;
      iVar2 = utext_extract_63(this->fInputText,0,_status,(UChar *)0x0,0,&local_28);
      _status = (ulong)iVar2;
    }
    iVar3 = (*(this->fWordBreakItr->super_BreakIterator).super_UObject._vptr_UObject[0x11])
                      (this->fWordBreakItr,_status & 0xffffffff);
    local_21 = (UBool)iVar3;
  }
  else {
    this->fHitEnd = '\x01';
    local_21 = '\x01';
  }
  return local_21;
}

Assistant:

UBool RegexMatcher::isUWordBoundary(int64_t pos) {
    UBool       returnVal = FALSE;
#if UCONFIG_NO_BREAK_ITERATION==0

    // If we haven't yet created a break iterator for this matcher, do it now.
    if (fWordBreakItr == NULL) {
        fWordBreakItr =
            (RuleBasedBreakIterator *)BreakIterator::createWordInstance(Locale::getEnglish(), fDeferredStatus);
        if (U_FAILURE(fDeferredStatus)) {
            return FALSE;
        }
        fWordBreakItr->setText(fInputText, fDeferredStatus);
    }

    if (pos >= fLookLimit) {
        fHitEnd = TRUE;
        returnVal = TRUE;   // With Unicode word rules, only positions within the interior of "real"
                            //    words are not boundaries.  All non-word chars stand by themselves,
                            //    with word boundaries on both sides.
    } else {
        if (!UTEXT_USES_U16(fInputText)) {
            // !!!: Would like a better way to do this!
            UErrorCode status = U_ZERO_ERROR;
            pos = utext_extract(fInputText, 0, pos, NULL, 0, &status);
        }
        returnVal = fWordBreakItr->isBoundary((int32_t)pos);
    }
#endif
    return   returnVal;
}